

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

void __thiscall sf::Shader::setUniform(Shader *this,string *name,Texture *texture)

{
  mapped_type pTVar1;
  bool bVar2;
  GLint GVar3;
  size_type sVar4;
  ostream *poVar5;
  mapped_type *ppTVar6;
  pointer ppVar7;
  iterator iStack_48;
  GLint maxUnits;
  _Self local_40;
  iterator it;
  int local_28;
  TransientContextLock local_21;
  int location;
  TransientContextLock lock;
  Texture *texture_local;
  string *name_local;
  Shader *this_local;
  
  if (this->m_shaderProgram != 0) {
    _location = texture;
    GlResource::TransientContextLock::TransientContextLock(&local_21);
    local_28 = getUniformLocation(this,name);
    if (local_28 != -1) {
      local_40._M_node =
           (_Base_ptr)
           std::
           map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
           ::find(&this->m_textures,&local_28);
      iStack_48 = std::
                  map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
                  ::end(&this->m_textures);
      bVar2 = std::operator==(&local_40,&stack0xffffffffffffffb8);
      pTVar1 = _location;
      if (bVar2) {
        GVar3 = anon_unknown.dwarf_ca316::getMaxTextureUnits();
        sVar4 = std::
                map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
                ::size(&this->m_textures);
        pTVar1 = _location;
        if (sVar4 + 1 < (ulong)(long)GVar3) {
          ppTVar6 = std::
                    map<int,_const_sf::Texture_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
                    ::operator[](&this->m_textures,&local_28);
          *ppTVar6 = pTVar1;
        }
        else {
          poVar5 = err();
          poVar5 = std::operator<<(poVar5,"Impossible to use texture \"");
          poVar5 = std::operator<<(poVar5,(string *)name);
          poVar5 = std::operator<<(poVar5,"\" for shader: all available texture units are used");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
      }
      else {
        ppVar7 = std::_Rb_tree_iterator<std::pair<const_int,_const_sf::Texture_*>_>::operator->
                           (&local_40);
        ppVar7->second = pTVar1;
      }
    }
    GlResource::TransientContextLock::~TransientContextLock(&local_21);
  }
  return;
}

Assistant:

void Shader::setUniform(const std::string& name, const Texture& texture)
{
    if (m_shaderProgram)
    {
        TransientContextLock lock;

        // Find the location of the variable in the shader
        int location = getUniformLocation(name);
        if (location != -1)
        {
            // Store the location -> texture mapping
            TextureTable::iterator it = m_textures.find(location);
            if (it == m_textures.end())
            {
                // New entry, make sure there are enough texture units
                GLint maxUnits = getMaxTextureUnits();
                if (m_textures.size() + 1 >= static_cast<std::size_t>(maxUnits))
                {
                    err() << "Impossible to use texture \"" << name << "\" for shader: all available texture units are used" << std::endl;
                    return;
                }

                m_textures[location] = &texture;
            }
            else
            {
                // Location already used, just replace the texture
                it->second = &texture;
            }
        }
    }
}